

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,google::protobuf::internal::SourceWrapper<absl::lts_20250127::Cord>>
          (MessageLite *this,SourceWrapper<absl::lts_20250127::Cord> *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ClassDataFull *pCVar3;
  TcParseTableBase *tc_table;
  char *failure_msg;
  LogMessageFatal local_20;
  ClassData *this_00;
  
  iVar2 = (*this->_vptr_MessageLite[4])();
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (ClassData *)0x0) {
    failure_msg = "data != nullptr";
    iVar2 = 0x3a2;
LAB_0025f6e8:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,iVar2,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  tc_table = this_00->tc_table;
  if (tc_table == (TcParseTableBase *)0x0) {
    if (this_00->is_lite == true) {
      failure_msg = "!data->is_lite";
      iVar2 = 0x3a6;
      goto LAB_0025f6e8;
    }
    pCVar3 = internal::ClassData::full(this_00);
    tc_table = (*pCVar3->descriptor_methods->get_tc_table)(this);
  }
  bVar1 = internal::SourceWrapper<absl::lts_20250127::Cord>::MergeInto<false>
                    (input,this,tc_table,kMerge);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}